

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

void __thiscall Fl_Input_::drawtext(Fl_Input_ *this,int X,int Y,int W,int H)

{
  uchar uVar1;
  byte bVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Fl_Color FVar10;
  undefined4 extraout_var;
  char *e;
  long lVar11;
  size_t sVar12;
  Fl_Window *win;
  int iVar13;
  undefined4 in_register_0000000c;
  uint uVar14;
  char *pcVar15;
  Fl_Boxtype FVar16;
  char *pcVar17;
  float x;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int offset2;
  int offset1;
  char buf [1024];
  undefined8 in_stack_fffffffffffffb08;
  undefined4 uVar22;
  float local_4e4;
  uint local_4bc;
  int local_4b8;
  int local_4b4;
  int local_49c;
  int local_498;
  int local_494;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  float local_46c;
  float local_468;
  float local_464;
  float local_460;
  uint local_45c;
  long local_458;
  long local_450;
  ulong local_448;
  ulong local_440;
  char local_438 [1032];
  
  local_490 = (ulong)(uint)X;
  uVar1 = (this->super_Fl_Widget).damage_;
  if (((Fl_Input_ *)Fl::focus_ != this) && (this->size_ == 0)) {
    if ((char)uVar1 < '\0') {
      return;
    }
    FVar16 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
    iVar4 = Fl::box_dx(FVar16);
    iVar5 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
    iVar6 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
    iVar7 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
    Fl_Widget::draw_box(&this->super_Fl_Widget,FVar16,X - iVar4,Y - iVar5,W + iVar6,H + iVar7,
                        (this->super_Fl_Widget).color_);
    return;
  }
  if ((Fl_Input_ *)Fl::focus_ != this) {
    local_4b4 = 0;
    local_4b8 = 0;
    if ((Fl_Input_ *)Fl::pushed_ != this) goto LAB_001ba861;
  }
  iVar4 = this->position_;
  local_4b8 = this->mark_;
  local_4b4 = local_4b8;
  if (local_4b8 < iVar4) {
    local_4b4 = iVar4;
  }
  if (iVar4 < local_4b8) {
    local_4b8 = iVar4;
  }
LAB_001ba861:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_);
  iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar6 = iVar5 / 2;
  pcVar17 = this->value_;
  local_480 = (ulong)(uint)(W - iVar6);
  iVar7 = 0;
  local_494 = 0;
  local_478 = 0;
  iVar4 = 0;
  while( true ) {
    e = expand(this,pcVar17,local_438);
    lVar11 = (long)this->position_;
    pcVar15 = this->value_;
    if (((long)pcVar17 - (long)pcVar15 <= lVar11) && (lVar11 <= (long)e - (long)pcVar15)) {
      dVar18 = expandpos(this,pcVar17,pcVar15 + lVar11,local_438,(int *)0x0);
      uVar14 = (uint)(dVar18 + 0.5);
      local_478 = (ulong)uVar14;
      if (((Fl_Input_ *)Fl::focus_ == this) && (was_up_down == 0)) {
        up_down_pos = (double)(int)uVar14;
      }
      iVar8 = this->xscroll_;
      if ((int)local_480 + iVar8 < (int)uVar14) {
        dVar18 = expandpos(this,pcVar17,e,local_438,(int *)0x0);
        iVar8 = (int)dVar18 + 4;
        if ((int)(iVar6 + uVar14) <= (int)dVar18 + 4) {
          iVar8 = iVar6 + uVar14;
        }
        iVar8 = iVar8 - W;
      }
      else if ((int)uVar14 < iVar8 + iVar6) {
        iVar8 = uVar14 - iVar6;
      }
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      iVar4 = iVar7;
      if (iVar8 != this->xscroll_) {
        this->xscroll_ = iVar8;
        this->mu_p = 0;
        this->erase_cursor_only = '\0';
      }
    }
    if (this->value_ + this->size_ <= e) break;
    pcVar17 = e + 1;
    local_494 = local_494 + -1;
    iVar7 = iVar7 + iVar5;
  }
  if (((this->super_Fl_Widget).type_ & 7) == 4) {
    iVar6 = this->yscroll_;
    iVar7 = iVar6;
    if (iVar4 < iVar6) {
      iVar7 = iVar4;
    }
    iVar8 = (iVar5 - H) + iVar4;
    if (iVar4 <= (H - iVar5) + iVar7) {
      iVar8 = iVar7;
    }
    iVar4 = -1;
    if (-1 < iVar8) {
      iVar4 = iVar8;
    }
    if (iVar4 != iVar6) {
      this->yscroll_ = iVar4;
      this->mu_p = 0;
      this->erase_cursor_only = '\0';
    }
  }
  else {
    this->yscroll_ = (iVar5 - H) / 2;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,local_490,(ulong)(uint)Y,CONCAT44(in_register_0000000c,W));
  iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
  local_4bc = this->textcolor_;
  if (iVar4 == 0) {
    local_4bc = fl_inactive(local_4bc);
  }
  pcVar17 = this->value_;
  iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
  iVar7 = (int)local_490;
  x = (float)((iVar7 - this->xscroll_) + 1);
  iVar4 = -this->yscroll_;
  if (iVar4 < H) {
    fVar19 = (float)(W + iVar7);
    local_464 = (float)iVar7;
    local_480 = CONCAT44(local_480._4_4_,-iVar5);
    local_468 = x + 2.0;
    local_46c = local_464 + -3.0;
    iVar8 = iVar5 + 3;
    iVar7 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar8 = iVar5;
      iVar7 = iVar5;
    }
    local_460 = (float)(iVar8 >> 2);
    local_45c = ~(iVar7 >> 3);
    local_450 = (long)local_4b8;
    local_458 = (long)local_4b4;
    local_488 = (ulong)(uint)((iVar5 + Y) - iVar6);
    local_440 = (ulong)((iVar5 + Y) - 4);
    local_448 = (ulong)((iVar5 + Y) - 1);
    do {
      iVar6 = iVar4;
      if (local_494 != 0) {
        e = expand(this,pcVar17,local_438);
      }
      uVar22 = (undefined4)((ulong)in_stack_fffffffffffffb08 >> 0x20);
      if ((int)local_480 < iVar6) {
        if ((char)uVar1 < '\0') {
LAB_001bad92:
          if (((local_4b8 < local_4b4) &&
              (pcVar15 = this->value_, local_450 <= (long)e - (long)pcVar15)) &&
             ((long)pcVar17 - (long)pcVar15 < local_458)) {
            pcVar15 = pcVar15 + local_450;
            local_498 = 0;
            local_4e4 = x;
            if (pcVar17 < pcVar15) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)local_4bc);
              dVar18 = expandpos(this,pcVar17,pcVar15,local_438,&local_498);
              local_4e4 = (float)dVar18 + x;
              fl_draw(local_438,local_498,x,(float)((int)local_488 + iVar6));
            }
            pcVar15 = this->value_ + local_458;
            if (e < pcVar15) {
              sVar12 = strlen(local_438);
              local_49c = (int)sVar12;
              fVar20 = fVar19;
            }
            else {
              dVar18 = expandpos(this,pcVar17,pcVar15,local_438,&local_49c);
              fVar20 = (float)dVar18 + x;
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)(this->super_Fl_Widget).color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                      (fl_graphics_driver,(ulong)(uint)(int)(local_4e4 + 0.5),
                       (ulong)(uint)(Y + iVar6),(ulong)(uint)(int)((fVar20 - local_4e4) + 0.5));
            FVar10 = fl_contrast(this->textcolor_,(this->super_Fl_Widget).color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar10);
            fVar21 = (float)((int)local_488 + iVar6);
            fl_draw(local_438 + local_498,local_49c - local_498,local_4e4,fVar21);
            if (pcVar15 < e) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)local_4bc);
              pcVar15 = local_438 + local_49c;
              sVar12 = strlen(pcVar15);
              iVar4 = (int)sVar12;
              goto LAB_001baec3;
            }
          }
          else {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)local_4bc);
            pcVar15 = local_438;
            sVar12 = strlen(pcVar15);
            fVar21 = (float)((int)local_488 + iVar6);
            iVar4 = (int)sVar12;
            fVar20 = x;
LAB_001baec3:
            fl_draw(pcVar15,iVar4,fVar20,fVar21);
          }
          if (-1 < (char)uVar1) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
          }
        }
        else {
          pcVar15 = this->value_ + this->mu_p;
          if (pcVar15 <= e) {
            bVar2 = (this->super_Fl_Widget).type_;
            if ((bVar2 & 8) != 0) {
              this->erase_cursor_only = '\0';
            }
            uVar3 = this->erase_cursor_only;
            if ((uVar3 == '\0') || (pcVar17 <= pcVar15)) {
              fVar21 = fVar19;
              if (pcVar17 < pcVar15) {
                dVar18 = expandpos(this,pcVar17,pcVar15,local_438,(int *)0x0);
                fVar20 = (float)dVar18 + x;
                if (this->erase_cursor_only == '\0') {
                  if (((this->super_Fl_Widget).type_ & 8) != 0) {
                    fVar20 = fVar20 + -3.0;
                  }
                }
                else {
                  fVar21 = fVar20 + 2.0;
                }
              }
              else {
                fVar21 = local_468;
                if (uVar3 == '\0') {
                  fVar21 = fVar19;
                }
                fVar20 = local_464;
                if (uVar3 == '\0' && (bVar2 & 8) != 0) {
                  fVar21 = fVar19;
                  fVar20 = local_46c;
                }
              }
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                        (fl_graphics_driver,(ulong)((int)fVar20 + local_45c),
                         (ulong)(uint)(Y + iVar6),
                         (ulong)(uint)(int)((fVar21 - fVar20) + 2.0 + local_460),
                         CONCAT44(extraout_var,iVar5));
              bVar2 = (this->super_Fl_Widget).box_;
              iVar4 = Fl::box_dx((uint)bVar2);
              iVar13 = (int)local_490;
              iVar7 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
              iVar8 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
              iVar9 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
              FVar10 = (this->super_Fl_Widget).color_;
              in_stack_fffffffffffffb08 = CONCAT44(uVar22,FVar10);
              Fl_Widget::draw_box(&this->super_Fl_Widget,(uint)bVar2,iVar13 - iVar4,Y - iVar7,
                                  iVar8 + W,iVar9 + H,FVar10);
              goto LAB_001bad92;
            }
          }
        }
        if ((local_4b8 == local_4b4) && ((Fl_Input_ *)Fl::focus_ == this)) {
          if (((long)pcVar17 - (long)this->value_ <= (long)this->position_) &&
             ((long)this->position_ <= (long)e - (long)this->value_)) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)this->cursor_color_);
            dVar18 = expandpos(this,pcVar17,this->value_ + this->position_,local_438,(int *)0x0);
            local_478 = (ulong)(uint)(int)(dVar18 + 0.5);
            fVar21 = (float)(int)(dVar18 + 0.5) + x;
            if (((this->super_Fl_Widget).type_ & 8) == 0) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                        (fl_graphics_driver,(ulong)(uint)(int)(fVar21 + 0.5),
                         (ulong)(uint)(Y + iVar6),2);
            }
            else {
              uVar14 = (int)local_448 + iVar6;
              in_stack_fffffffffffffb08 =
                   CONCAT44((int)((ulong)in_stack_fffffffffffffb08 >> 0x20),uVar14);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                        (fl_graphics_driver,(ulong)(uint)(int)(fVar21 + -2.5),(ulong)uVar14,
                         (ulong)(uint)(int)(fVar21 + 0.5),(ulong)(uint)((int)local_440 + iVar6),
                         (ulong)(uint)(int)(fVar21 + 3.5),in_stack_fffffffffffffb08);
            }
          }
        }
      }
      if (this->value_ + this->size_ <= e) break;
      if ((*e == ' ') || (*e == '\n')) {
        e = e + 1;
      }
      pcVar17 = e;
      iVar4 = iVar6 + iVar5;
    } while (iVar6 + iVar5 < H);
    iVar4 = iVar6 + iVar5;
  }
  if ((((-1 < (char)uVar1) && (((this->super_Fl_Widget).type_ & 7) == 4)) && (iVar4 < H)) &&
     ((this->erase_cursor_only == '\0' || (pcVar17 <= this->value_ + this->mu_p)))) {
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = iVar5;
    iVar9 = (int)local_490;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,local_490 & 0xffffffff,(ulong)(uint)(Y + iVar4),W,
               (ulong)(uint)(H - iVar4));
    FVar16 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
    iVar5 = Fl::box_dx(FVar16);
    iVar6 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
    iVar7 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
    iVar8 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
    Fl_Widget::draw_box(&this->super_Fl_Widget,FVar16,iVar9 - iVar5,Y - iVar6,W + iVar7,iVar8 + H,
                        (this->super_Fl_Widget).color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  if ((Fl_Input_ *)Fl::focus_ == this) {
    iVar5 = this->textfont_;
    iVar6 = this->textsize_;
    iVar8 = (int)local_478;
    iVar7 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
    win = Fl_Widget::window(&this->super_Fl_Widget);
    fl_set_spot(iVar5,iVar6,iVar8 + (int)x,(iVar4 + Y) - iVar7,W,H,win);
  }
  return;
}

Assistant:

void Fl_Input_::drawtext(int X, int Y, int W, int H) {
  int do_mu = !(damage()&FL_DAMAGE_ALL);

  if (Fl::focus()!=this && !size()) {
    if (do_mu) { // we have to erase it if cursor was there
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    }
    return;
  }

  int selstart, selend;
  if (Fl::focus()!=this && /*Fl::selection_owner()!=this &&*/ Fl::pushed()!=this)
    selstart = selend = 0;
  else if (position() <= mark()) {
    selstart = position(); selend = mark();
  } else {
    selend = position(); selstart = mark();
  }

  setfont();
  const char *p, *e;
  char buf[MAXBUF];

  // count how many lines and put the last one into the buffer:
  // And figure out where the cursor is:
  int height = fl_height();
  int threshold = height/2;
  int lines;
  int curx, cury;
  for (p=value(), curx=cury=lines=0; ;) {
    e = expand(p, buf);
    if (position() >= p-value() && position() <= e-value()) {
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (Fl::focus()==this && !was_up_down) up_down_pos = curx;
      cury = lines*height;
      int newscroll = xscroll_;
      if (curx > newscroll+W-threshold) {
	// figure out scrolling so there is space after the cursor:
	newscroll = curx+threshold-W;
	// figure out the furthest left we ever want to scroll:
	int ex = int(expandpos(p, e, buf, 0))+4-W;
	// use minimum of both amounts:
	if (ex < newscroll) newscroll = ex;
      } else if (curx < newscroll+threshold) {
	newscroll = curx-threshold;
      }
      if (newscroll < 0) newscroll = 0;
      if (newscroll != xscroll_) {
	xscroll_ = newscroll;
	mu_p = 0; erase_cursor_only = 0;
      }
    }
    lines++;
    if (e >= value_+size_) break;
    p = e+1;
  }

  // adjust the scrolling:
  if (input_type()==FL_MULTILINE_INPUT) {
    int newy = yscroll_;
    if (cury < newy) newy = cury;
    if (cury > newy+H-height) newy = cury-H+height;
    if (newy < -1) newy = -1;
    if (newy != yscroll_) {yscroll_ = newy; mu_p = 0; erase_cursor_only = 0;}
  } else {
    yscroll_ = -(H-height)/2;
  }

  fl_push_clip(X, Y, W, H);
  Fl_Color tc = active_r() ? textcolor() : fl_inactive(textcolor());

  p = value();
  // visit each line and draw it:
  int desc = height-fl_descent();
  float xpos = (float)(X - xscroll_ + 1);
  int ypos = -yscroll_;
  for (; ypos < H;) {

    // re-expand line unless it is the last one calculated above:
    if (lines>1) e = expand(p, buf);

    if (ypos <= -height) goto CONTINUE; // clipped off top

    if (do_mu) {	// for minimal update:
      const char* pp = value()+mu_p; // pointer to where minimal update starts
      if (e < pp) goto CONTINUE2; // this line is before the changes
      if (readonly()) erase_cursor_only = 0; // this isn't the most efficient way
      if (erase_cursor_only && p > pp) goto CONTINUE2; // this line is after
      // calculate area to erase:
      float r = (float)(X+W);
      float xx;
      if (p >= pp) {
	xx = (float)X;
	if (erase_cursor_only) r = xpos+2;
	else if (readonly()) xx -= 3;
      } else {
	xx = xpos + (float)expandpos(p, pp, buf, 0);
	if (erase_cursor_only) r = xx+2;
	else if (readonly()) xx -= 3;
      }
      // clip to and erase it:
      fl_push_clip((int)xx-1-height/8, Y+ypos, (int)(r-xx+2+height/4), height);
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
      // it now draws entire line over it
      // this should not draw letters to left of erased area, but
      // that is nyi.
    }

    // Draw selection area if required:
    if (selstart < selend && selstart <= e-value() && selend > p-value()) {
      const char* pp = value()+selstart;
      float x1 = xpos;
      int offset1 = 0;
      if (pp > p) {
	fl_color(tc);
	x1 += (float)expandpos(p, pp, buf, &offset1);
	fl_draw(buf, offset1, xpos, (float)(Y+ypos+desc));
      }
      pp = value()+selend;
      float x2 = (float)(X+W);
      int offset2;
      if (pp <= e) x2 = xpos + (float)expandpos(p, pp, buf, &offset2);
      else offset2 = (int) strlen(buf);
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text 
      if (Fl::compose_state) {
        fl_color(textcolor());
      }
      else 
#endif
      {
      fl_color(selection_color());
      fl_rectf((int)(x1+0.5), Y+ypos, (int)(x2-x1+0.5), height);
      fl_color(fl_contrast(textcolor(), selection_color()));
      }
      fl_draw(buf+offset1, offset2-offset1, x1, (float)(Y+ypos+desc));
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text
      if (Fl::compose_state) {
        fl_color( fl_color_average(textcolor(), color(), 0.6) );
        float width = fl_width(buf+offset1, offset2-offset1);
        fl_line(x1, Y+ypos+height-1, x1+width, Y+ypos+height-1);
      }
#endif
      if (pp < e) {
	fl_color(tc);
	fl_draw(buf+offset2, (int) strlen(buf+offset2), x2, (float)(Y+ypos+desc));
      }
    } else {
      // draw unselected text
      fl_color(tc);
      fl_draw(buf, (int) strlen(buf), xpos, (float)(Y+ypos+desc));
    }

    if (do_mu) fl_pop_clip();

  CONTINUE2:
    // draw the cursor:
    if (Fl::focus() == this && (
#ifdef __APPLE__
				Fl::compose_state || 
#endif
				selstart == selend) &&
	position() >= p-value() && position() <= e-value()) {
      fl_color(cursor_color());
      // cursor position may need to be recomputed (see STR #2486)
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (readonly()) {
        fl_line((int)(xpos+curx-2.5f), Y+ypos+height-1,
	        (int)(xpos+curx+0.5f), Y+ypos+height-4,
	        (int)(xpos+curx+3.5f), Y+ypos+height-1);
      } else {
        fl_rectf((int)(xpos+curx+0.5), Y+ypos, 2, height);
      }
#ifdef __APPLE__
      Fl::insertion_point_location(xpos+curx, Y+ypos+height, height);
#endif
    }

  CONTINUE:
    ypos += height;
    if (e >= value_+size_) break;
    if (*e == '\n' || *e == ' ') e++;
    p = e;
  }

  // for minimal update, erase all lines below last one if necessary:
  if (input_type()==FL_MULTILINE_INPUT && do_mu && ypos<H
      && (!erase_cursor_only || p <= value()+mu_p)) {
    if (ypos < 0) ypos = 0;
    fl_push_clip(X, Y+ypos, W, H-ypos);
    draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
             W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    fl_pop_clip();
  }

  fl_pop_clip();
  if (Fl::focus() == this) {
       fl_set_spot(textfont(), textsize(),
               (int)xpos+curx, Y+ypos-fl_descent(), W, H, window());
  }
}